

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall
ON_2dVector::IsPerpendicularTo(ON_2dVector *this,ON_2dVector *v,double angle_tolerance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double ll;
  bool rc;
  double angle_tolerance_local;
  ON_2dVector *v_local;
  ON_2dVector *this_local;
  
  ll._7_1_ = false;
  dVar5 = Length(this);
  dVar6 = Length(v);
  if (0.0 < dVar5 * dVar6) {
    dVar1 = this->x;
    dVar2 = v->x;
    dVar3 = this->y;
    dVar4 = v->y;
    dVar7 = sin(angle_tolerance);
    ll._7_1_ = ABS((dVar1 * dVar2 + dVar3 * dVar4) / (dVar5 * dVar6)) <= dVar7;
  }
  return ll._7_1_;
}

Assistant:

bool ON_2dVector::IsPerpendicularTo(
      // returns true:  this and other vectors are perpendicular
      //         false: this and other vectors are not perpendicular
      //                or at least one of the vectors is zero
      const ON_2dVector& v,
      double angle_tolerance // (default=ON_DEFAULT_ANGLE_TOLERANCE) radians
      ) const
{
  bool rc = false;
  const double ll = Length()*v.Length();
  if ( ll > 0.0 ) {
    if ( fabs((x*v.x + y*v.y)/ll) <= sin(angle_tolerance) )
      rc = true;
  }
  return rc;
}